

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Scale_x86_avx512::forward_inplace
          (Scale_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs,
          Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  long lVar9;
  void *pvVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [24];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  int iVar21;
  reference pvVar22;
  reference pvVar23;
  undefined8 *puVar24;
  undefined1 (*pauVar25) [24];
  undefined8 *puVar26;
  int iVar27;
  int iVar28;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  undefined1 auVar29 [64];
  __m128 _p128_5;
  __m256 _p256_5;
  __m512 _p512_5;
  int i_10;
  __m128 _p128_4;
  __m256 _p256_4;
  __m512 _p512_4;
  int i_9;
  __m512 _b512_1;
  __m256 _b256_1;
  __m128 _b128_1;
  float b_1;
  __m512 _s512_3;
  __m256 _s256_3;
  __m128 _s128_3;
  float s_1;
  float *ptr_2;
  int q;
  int size_2;
  __m128 _p128_3;
  __m256 _p256_3;
  __m512 _p512_3;
  int j_1;
  __m128 _p128_2;
  __m256 _p256_2;
  __m512 _p512_2;
  int j;
  __m512 _b512;
  __m256 _b256;
  __m128 _b128;
  float b;
  __m512 _s512_2;
  __m256 _s256_2;
  __m128 _s128_2;
  float s;
  float *ptr_1;
  int i_8;
  int size_1;
  int i_7;
  __m128 _s128_1;
  __m128 _p128_1;
  int i_6;
  int ii_5;
  __m256 _s256_1;
  __m256 _p256_1;
  int i_5;
  int ii_4;
  __m512 _s512_1;
  __m512 _p512_1;
  int i_4;
  int ii_3;
  int remain_size_start_1;
  int nn_size_1;
  int i_3;
  __m128 _bias128;
  __m128 _s128;
  __m128 _p128;
  int i_2;
  int ii_2;
  __m256 _bias256;
  __m256 _s256;
  __m256 _p256;
  int i_1;
  int ii_1;
  __m512 _bias512;
  __m512 _s512;
  __m512 _p512;
  int i;
  int ii;
  int remain_size_start;
  int nn_size;
  int size;
  float *ptr;
  float *bias;
  float *scale;
  int elempack;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *scale_blob;
  Mat *bottom_top_blob;
  Mat *m;
  undefined1 local_1b40 [64];
  undefined1 local_1b00 [32];
  undefined8 local_1ad0;
  undefined8 uStack_1ac8;
  undefined1 local_1ac0 [64];
  undefined1 local_1a60 [32];
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined1 local_1a00 [64];
  undefined1 local_19c0 [32];
  undefined8 local_1990;
  undefined8 uStack_1988;
  undefined1 local_1980 [64];
  undefined1 local_1940 [32];
  undefined8 local_1910;
  undefined8 uStack_1908;
  int local_1874;
  int local_17c4;
  undefined1 (*local_1640) [64];
  int local_1638;
  int local_15b4;
  int local_1504;
  undefined1 (*local_13e8) [64];
  int local_13dc;
  int local_13d4;
  int local_13a4;
  int local_1344;
  int local_1290;
  int local_1284;
  int local_1244;
  int local_11c4;
  int local_10f0;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 uStack_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 uStack_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 uStack_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 uStack_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 uStack_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 uStack_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined4 uStack_5a4;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined4 uStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined4 uStack_524;
  float local_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float local_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float local_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  
  pvVar22 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  pvVar23 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar21 = pvVar22->w;
  iVar3 = pvVar22->h;
  iVar4 = pvVar22->d;
  iVar5 = pvVar22->c;
  iVar6 = pvVar22->dims;
  iVar7 = pvVar22->elempack;
  pvVar8 = pvVar23->data;
  lVar9 = *(long *)(in_RDI + 0x120);
  if (iVar6 == 1) {
    pvVar10 = pvVar22->data;
    iVar27 = iVar21 * iVar7;
    if (*(int *)(in_RDI + 0xd4) == 0) {
      for (local_1290 = 0; local_1290 < iVar27 / 0x10; local_1290 = local_1290 + 1) {
        iVar28 = local_1290 * 0x10;
        puVar24 = (undefined8 *)((long)pvVar10 + (long)iVar28 * 4);
        auVar29 = vmulps_avx512f(*(undefined1 (*) [64])((long)pvVar10 + (long)iVar28 * 4),
                                 *(undefined1 (*) [64])((long)pvVar8 + (long)iVar28 * 4));
        local_e00 = auVar29._0_8_;
        uStack_df8 = auVar29._8_8_;
        uStack_df0 = auVar29._16_8_;
        uStack_de8 = auVar29._24_8_;
        uStack_de0 = auVar29._32_8_;
        uStack_dd8 = auVar29._40_8_;
        uStack_dd0 = auVar29._48_8_;
        uStack_dc8 = auVar29._56_8_;
        *puVar24 = local_e00;
        puVar24[1] = uStack_df8;
        puVar24[2] = uStack_df0;
        puVar24[3] = uStack_de8;
        puVar24[4] = uStack_de0;
        puVar24[5] = uStack_dd8;
        puVar24[6] = uStack_dd0;
        puVar24[7] = uStack_dc8;
      }
      local_13d4 = (iVar27 / 0x10) * 0x10;
      iVar28 = (iVar27 % 0x10) / 8;
      for (local_1344 = 0; local_1344 < iVar28; local_1344 = local_1344 + 1) {
        iVar20 = local_13d4 + local_1344 * 8;
        pauVar25 = (undefined1 (*) [24])((long)pvVar10 + (long)iVar20 * 4);
        auVar16 = *pauVar25;
        uVar12 = *(undefined8 *)pauVar25[1];
        puVar24 = (undefined8 *)((long)pvVar8 + (long)iVar20 * 4);
        puVar26 = (undefined8 *)((long)pvVar10 + (long)iVar20 * 4);
        local_540 = auVar16._0_4_;
        fStack_53c = auVar16._4_4_;
        fStack_538 = auVar16._8_4_;
        fStack_534 = auVar16._12_4_;
        fStack_530 = auVar16._16_4_;
        fStack_52c = auVar16._20_4_;
        fStack_528 = (float)uVar12;
        uStack_524 = (undefined4)((ulong)uVar12 >> 0x20);
        local_560 = (float)*puVar24;
        fStack_55c = (float)((ulong)*puVar24 >> 0x20);
        fStack_558 = (float)puVar24[1];
        fStack_554 = (float)((ulong)puVar24[1] >> 0x20);
        fStack_550 = (float)puVar24[2];
        fStack_54c = (float)((ulong)puVar24[2] >> 0x20);
        fStack_548 = (float)puVar24[3];
        *puVar26 = CONCAT44(fStack_53c * fStack_55c,local_540 * local_560);
        puVar26[1] = CONCAT44(fStack_534 * fStack_554,fStack_538 * fStack_558);
        puVar26[2] = CONCAT44(fStack_52c * fStack_54c,fStack_530 * fStack_550);
        puVar26[3] = CONCAT44(uStack_524,fStack_528 * fStack_548);
      }
      local_13d4 = iVar28 * 8 + local_13d4;
      iVar28 = (iVar27 - local_13d4) / 4;
      for (local_13a4 = 0; local_13a4 < iVar28; local_13a4 = local_13a4 + 1) {
        iVar20 = local_13d4 + local_13a4 * 4;
        puVar24 = (undefined8 *)((long)pvVar10 + (long)iVar20 * 4);
        uVar12 = *puVar24;
        uVar13 = puVar24[1];
        puVar24 = (undefined8 *)((long)pvVar8 + (long)iVar20 * 4);
        uVar14 = *puVar24;
        uVar15 = puVar24[1];
        puVar24 = (undefined8 *)((long)pvVar10 + (long)iVar20 * 4);
        local_4c0 = (float)uVar12;
        fStack_4bc = (float)((ulong)uVar12 >> 0x20);
        fStack_4b8 = (float)uVar13;
        fStack_4b4 = (float)((ulong)uVar13 >> 0x20);
        local_4d0 = (float)uVar14;
        fStack_4cc = (float)((ulong)uVar14 >> 0x20);
        fStack_4c8 = (float)uVar15;
        fStack_4c4 = (float)((ulong)uVar15 >> 0x20);
        *puVar24 = CONCAT44(fStack_4bc * fStack_4cc,local_4c0 * local_4d0);
        puVar24[1] = CONCAT44(fStack_4b4 * fStack_4c4,fStack_4b8 * fStack_4c8);
      }
      for (local_13d4 = iVar28 * 4 + local_13d4; local_13d4 < iVar27; local_13d4 = local_13d4 + 1) {
        *(float *)((long)pvVar10 + (long)local_13d4 * 4) =
             *(float *)((long)pvVar10 + (long)local_13d4 * 4) *
             *(float *)((long)pvVar8 + (long)local_13d4 * 4);
      }
    }
    else {
      for (local_10f0 = 0; local_10f0 < iVar27 / 0x10; local_10f0 = local_10f0 + 1) {
        iVar28 = local_10f0 * 0x10;
        puVar24 = (undefined8 *)((long)pvVar10 + (long)iVar28 * 4);
        auVar29 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)pvVar8 + (long)iVar28 * 4),
                                      *(undefined1 (*) [64])((long)pvVar10 + (long)iVar28 * 4),
                                      *(undefined1 (*) [64])(lVar9 + (long)iVar28 * 4));
        local_d80 = auVar29._0_8_;
        uStack_d78 = auVar29._8_8_;
        uStack_d70 = auVar29._16_8_;
        uStack_d68 = auVar29._24_8_;
        uStack_d60 = auVar29._32_8_;
        uStack_d58 = auVar29._40_8_;
        uStack_d50 = auVar29._48_8_;
        uStack_d48 = auVar29._56_8_;
        *puVar24 = local_d80;
        puVar24[1] = uStack_d78;
        puVar24[2] = uStack_d70;
        puVar24[3] = uStack_d68;
        puVar24[4] = uStack_d60;
        puVar24[5] = uStack_d58;
        puVar24[6] = uStack_d50;
        puVar24[7] = uStack_d48;
      }
      local_1284 = (iVar27 / 0x10) * 0x10;
      iVar28 = (iVar27 % 0x10) / 8;
      for (local_11c4 = 0; local_11c4 < iVar28; local_11c4 = local_11c4 + 1) {
        iVar20 = local_1284 + local_11c4 * 8;
        puVar24 = (undefined8 *)((long)pvVar10 + (long)iVar20 * 4);
        auVar11 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)pvVar8 + (long)iVar20 * 4),
                                  *(undefined1 (*) [32])((long)pvVar10 + (long)iVar20 * 4),
                                  *(undefined1 (*) [32])(lVar9 + (long)iVar20 * 4));
        local_8e0 = auVar11._0_8_;
        uStack_8d8 = auVar11._8_8_;
        *puVar24 = local_8e0;
        puVar24[1] = uStack_8d8;
        puVar24[2] = 0;
        puVar24[3] = 0;
      }
      local_1284 = iVar28 * 8 + local_1284;
      iVar28 = (iVar27 - local_1284) / 4;
      for (local_1244 = 0; local_1244 < iVar28; local_1244 = local_1244 + 1) {
        iVar20 = local_1284 + local_1244 * 4;
        puVar24 = (undefined8 *)((long)pvVar10 + (long)iVar20 * 4);
        auVar11 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)pvVar8 + (long)iVar20 * 4),
                                  *(undefined1 (*) [16])((long)pvVar10 + (long)iVar20 * 4),
                                  *(undefined1 (*) [16])(lVar9 + (long)iVar20 * 4));
        local_7e0 = auVar11._0_8_;
        uStack_7d8 = auVar11._8_8_;
        *puVar24 = local_7e0;
        puVar24[1] = uStack_7d8;
      }
      for (local_1284 = iVar28 * 4 + local_1284; local_1284 < iVar27; local_1284 = local_1284 + 1) {
        *(float *)((long)pvVar10 + (long)local_1284 * 4) =
             *(float *)((long)pvVar10 + (long)local_1284 * 4) *
             *(float *)((long)pvVar8 + (long)local_1284 * 4) +
             *(float *)(lVar9 + (long)local_1284 * 4);
      }
    }
  }
  if (iVar6 == 2) {
    iVar27 = iVar21 * iVar7;
    for (local_13dc = 0; local_13dc < iVar3; local_13dc = local_13dc + 1) {
      local_13e8 = (undefined1 (*) [64])
                   ((long)pvVar22->data + (long)pvVar22->w * (long)local_13dc * pvVar22->elemsize);
      fVar1 = *(float *)((long)pvVar8 + (long)local_13dc * 4);
      if (iVar7 == 4) {
        puVar24 = (undefined8 *)((long)pvVar8 + (long)(local_13dc << 2) * 4);
        local_1910 = *puVar24;
        uStack_1908 = puVar24[1];
      }
      else {
        local_1910 = CONCAT44(fVar1,fVar1);
        uStack_1908 = CONCAT44(fVar1,fVar1);
      }
      if (iVar7 == 8) {
        local_1940 = *(undefined1 (*) [32])((long)pvVar8 + (long)(local_13dc << 3) * 4);
      }
      else {
        local_1940._8_8_ = uStack_1908;
        local_1940._0_8_ = local_1910;
        local_1940._24_8_ = uStack_1908;
        local_1940._16_8_ = local_1910;
      }
      if (iVar7 == 0x10) {
        local_1980 = *(undefined1 (*) [64])((long)pvVar8 + (long)(local_13dc << 4) * 4);
      }
      else {
        local_1980 = vinsertf64x4_avx512f(ZEXT3264(local_1940),local_1940,1);
      }
      if (*(int *)(in_RDI + 0xd4) == 0) {
        for (local_15b4 = 0; local_15b4 + 0xf < iVar27; local_15b4 = local_15b4 + 0x10) {
          auVar29 = vmulps_avx512f(*local_13e8,local_1980);
          local_f00 = auVar29._0_8_;
          uStack_ef8 = auVar29._8_8_;
          uStack_ef0 = auVar29._16_8_;
          uStack_ee8 = auVar29._24_8_;
          uStack_ee0 = auVar29._32_8_;
          uStack_ed8 = auVar29._40_8_;
          uStack_ed0 = auVar29._48_8_;
          uStack_ec8 = auVar29._56_8_;
          *(undefined8 *)*local_13e8 = local_f00;
          *(undefined8 *)(*local_13e8 + 8) = uStack_ef8;
          *(undefined8 *)(*local_13e8 + 0x10) = uStack_ef0;
          *(undefined8 *)(*local_13e8 + 0x18) = uStack_ee8;
          *(undefined8 *)(*local_13e8 + 0x20) = uStack_ee0;
          *(undefined8 *)(*local_13e8 + 0x28) = uStack_ed8;
          *(undefined8 *)(*local_13e8 + 0x30) = uStack_ed0;
          *(undefined8 *)(*local_13e8 + 0x38) = uStack_ec8;
          local_13e8 = local_13e8 + 1;
        }
        for (; local_15b4 + 7 < iVar27; local_15b4 = local_15b4 + 8) {
          auVar16 = *(undefined1 (*) [24])*local_13e8;
          local_580 = auVar16._0_4_;
          fStack_57c = auVar16._4_4_;
          fStack_578 = auVar16._8_4_;
          fStack_574 = auVar16._12_4_;
          fStack_570 = auVar16._16_4_;
          fStack_56c = auVar16._20_4_;
          fStack_568 = (float)*(undefined8 *)(*local_13e8 + 0x18);
          uStack_564 = (undefined4)((ulong)*(undefined8 *)(*local_13e8 + 0x18) >> 0x20);
          local_5a0 = local_1940._0_4_;
          fStack_59c = local_1940._4_4_;
          fStack_598 = local_1940._8_4_;
          fStack_594 = local_1940._12_4_;
          fStack_590 = local_1940._16_4_;
          fStack_58c = local_1940._20_4_;
          fStack_588 = local_1940._24_4_;
          *(ulong *)*local_13e8 = CONCAT44(fStack_57c * fStack_59c,local_580 * local_5a0);
          *(ulong *)(*local_13e8 + 8) = CONCAT44(fStack_574 * fStack_594,fStack_578 * fStack_598);
          *(ulong *)(*local_13e8 + 0x10) = CONCAT44(fStack_56c * fStack_58c,fStack_570 * fStack_590)
          ;
          *(ulong *)(*local_13e8 + 0x18) = CONCAT44(uStack_564,fStack_568 * fStack_588);
          local_13e8 = (undefined1 (*) [64])(*local_13e8 + 0x20);
        }
        for (; local_15b4 + 3 < iVar27; local_15b4 = local_15b4 + 4) {
          local_4e0 = (float)*(undefined8 *)*local_13e8;
          fStack_4dc = (float)((ulong)*(undefined8 *)*local_13e8 >> 0x20);
          fStack_4d8 = (float)*(undefined8 *)(*local_13e8 + 8);
          fStack_4d4 = (float)((ulong)*(undefined8 *)(*local_13e8 + 8) >> 0x20);
          local_4f0 = (float)local_1910;
          fStack_4ec = (float)((ulong)local_1910 >> 0x20);
          fStack_4e8 = (float)uStack_1908;
          fStack_4e4 = (float)((ulong)uStack_1908 >> 0x20);
          *(ulong *)*local_13e8 = CONCAT44(fStack_4dc * fStack_4ec,local_4e0 * local_4f0);
          *(ulong *)(*local_13e8 + 8) = CONCAT44(fStack_4d4 * fStack_4e4,fStack_4d8 * fStack_4e8);
          local_13e8 = (undefined1 (*) [64])(*local_13e8 + 0x10);
        }
        for (; local_15b4 < iVar27; local_15b4 = local_15b4 + 1) {
          *(float *)*local_13e8 = *(float *)*local_13e8 * fVar1;
          local_13e8 = (undefined1 (*) [64])(*local_13e8 + 4);
        }
      }
      else {
        fVar2 = *(float *)(lVar9 + (long)local_13dc * 4);
        if (iVar7 == 4) {
          puVar24 = (undefined8 *)(lVar9 + (long)(local_13dc << 2) * 4);
          local_1990 = *puVar24;
          uStack_1988 = puVar24[1];
        }
        else {
          local_1990 = CONCAT44(fVar2,fVar2);
          uStack_1988 = CONCAT44(fVar2,fVar2);
        }
        if (iVar7 == 8) {
          local_19c0 = *(undefined1 (*) [32])(lVar9 + (long)(local_13dc << 3) * 4);
        }
        else {
          local_19c0._8_8_ = uStack_1988;
          local_19c0._0_8_ = local_1990;
          local_19c0._24_8_ = uStack_1988;
          local_19c0._16_8_ = local_1990;
        }
        if (iVar7 == 0x10) {
          local_1a00 = *(undefined1 (*) [64])(lVar9 + (long)(local_13dc << 4) * 4);
        }
        else {
          local_1a00 = vinsertf64x4_avx512f(ZEXT3264(local_19c0),local_19c0,1);
        }
        for (local_1504 = 0; local_1504 + 0xf < iVar27; local_1504 = local_1504 + 0x10) {
          auVar29 = vfmadd213ps_avx512f(local_1980,*local_13e8,local_1a00);
          local_e80 = auVar29._0_8_;
          uStack_e78 = auVar29._8_8_;
          uStack_e70 = auVar29._16_8_;
          uStack_e68 = auVar29._24_8_;
          uStack_e60 = auVar29._32_8_;
          uStack_e58 = auVar29._40_8_;
          uStack_e50 = auVar29._48_8_;
          uStack_e48 = auVar29._56_8_;
          *(undefined8 *)*local_13e8 = local_e80;
          *(undefined8 *)(*local_13e8 + 8) = uStack_e78;
          *(undefined8 *)(*local_13e8 + 0x10) = uStack_e70;
          *(undefined8 *)(*local_13e8 + 0x18) = uStack_e68;
          *(undefined8 *)(*local_13e8 + 0x20) = uStack_e60;
          *(undefined8 *)(*local_13e8 + 0x28) = uStack_e58;
          *(undefined8 *)(*local_13e8 + 0x30) = uStack_e50;
          *(undefined8 *)(*local_13e8 + 0x38) = uStack_e48;
          local_13e8 = local_13e8 + 1;
        }
        for (; local_1504 + 7 < iVar27; local_1504 = local_1504 + 8) {
          auVar11 = vfmadd213ps_fma(local_1940,*(undefined1 (*) [32])*local_13e8,local_19c0);
          local_960 = auVar11._0_8_;
          uStack_958 = auVar11._8_8_;
          *(undefined8 *)*local_13e8 = local_960;
          *(undefined8 *)(*local_13e8 + 8) = uStack_958;
          *(undefined8 *)(*local_13e8 + 0x10) = 0;
          *(undefined8 *)(*local_13e8 + 0x18) = 0;
          local_13e8 = (undefined1 (*) [64])(*local_13e8 + 0x20);
        }
        for (; local_1504 + 3 < iVar27; local_1504 = local_1504 + 4) {
          auVar19._8_8_ = uStack_1908;
          auVar19._0_8_ = local_1910;
          auVar11._8_8_ = uStack_1988;
          auVar11._0_8_ = local_1990;
          auVar11 = vfmadd213ps_fma(auVar19,*(undefined1 (*) [16])*local_13e8,auVar11);
          local_2f0 = auVar11._0_8_;
          uStack_2e8 = auVar11._8_8_;
          *(undefined8 *)*local_13e8 = local_2f0;
          *(undefined8 *)(*local_13e8 + 8) = uStack_2e8;
          local_13e8 = (undefined1 (*) [64])(*local_13e8 + 0x10);
        }
        for (; local_1504 < iVar27; local_1504 = local_1504 + 1) {
          *(float *)*local_13e8 = *(float *)*local_13e8 * fVar1 + fVar2;
          local_13e8 = (undefined1 (*) [64])(*local_13e8 + 4);
        }
      }
    }
  }
  if ((iVar6 == 3) || (iVar6 == 4)) {
    iVar21 = iVar21 * iVar3 * iVar4 * iVar7;
    for (local_1638 = 0; local_1638 < iVar5; local_1638 = local_1638 + 1) {
      local_1640 = (undefined1 (*) [64])
                   ((long)pvVar22->data + pvVar22->cstep * (long)local_1638 * pvVar22->elemsize);
      fVar1 = *(float *)((long)pvVar8 + (long)local_1638 * 4);
      if (iVar7 == 4) {
        puVar24 = (undefined8 *)((long)pvVar8 + (long)(local_1638 << 2) * 4);
        local_1a40 = *puVar24;
        uStack_1a38 = puVar24[1];
      }
      else {
        local_1a40 = CONCAT44(fVar1,fVar1);
        uStack_1a38 = CONCAT44(fVar1,fVar1);
      }
      if (iVar7 == 8) {
        local_1a60 = *(undefined1 (*) [32])((long)pvVar8 + (long)(local_1638 << 3) * 4);
      }
      else {
        local_1a60._8_8_ = uStack_1a38;
        local_1a60._0_8_ = local_1a40;
        local_1a60._24_8_ = uStack_1a38;
        local_1a60._16_8_ = local_1a40;
      }
      if (iVar7 == 0x10) {
        local_1ac0 = *(undefined1 (*) [64])((long)pvVar8 + (long)(local_1638 << 4) * 4);
      }
      else {
        local_1ac0 = vinsertf64x4_avx512f(ZEXT3264(local_1a60),local_1a60,1);
      }
      if (*(int *)(in_RDI + 0xd4) == 0) {
        for (local_1874 = 0; local_1874 + 0xf < iVar21; local_1874 = local_1874 + 0x10) {
          auVar29 = vmulps_avx512f(*local_1640,local_1ac0);
          local_1000 = auVar29._0_8_;
          uStack_ff8 = auVar29._8_8_;
          uStack_ff0 = auVar29._16_8_;
          uStack_fe8 = auVar29._24_8_;
          uStack_fe0 = auVar29._32_8_;
          uStack_fd8 = auVar29._40_8_;
          uStack_fd0 = auVar29._48_8_;
          uStack_fc8 = auVar29._56_8_;
          *(undefined8 *)*local_1640 = local_1000;
          *(undefined8 *)(*local_1640 + 8) = uStack_ff8;
          *(undefined8 *)(*local_1640 + 0x10) = uStack_ff0;
          *(undefined8 *)(*local_1640 + 0x18) = uStack_fe8;
          *(undefined8 *)(*local_1640 + 0x20) = uStack_fe0;
          *(undefined8 *)(*local_1640 + 0x28) = uStack_fd8;
          *(undefined8 *)(*local_1640 + 0x30) = uStack_fd0;
          *(undefined8 *)(*local_1640 + 0x38) = uStack_fc8;
          local_1640 = local_1640 + 1;
        }
        for (; local_1874 + 7 < iVar21; local_1874 = local_1874 + 8) {
          auVar16 = *(undefined1 (*) [24])*local_1640;
          local_5c0 = auVar16._0_4_;
          fStack_5bc = auVar16._4_4_;
          fStack_5b8 = auVar16._8_4_;
          fStack_5b4 = auVar16._12_4_;
          fStack_5b0 = auVar16._16_4_;
          fStack_5ac = auVar16._20_4_;
          fStack_5a8 = (float)*(undefined8 *)(*local_1640 + 0x18);
          uStack_5a4 = (undefined4)((ulong)*(undefined8 *)(*local_1640 + 0x18) >> 0x20);
          local_5e0 = local_1a60._0_4_;
          fStack_5dc = local_1a60._4_4_;
          fStack_5d8 = local_1a60._8_4_;
          fStack_5d4 = local_1a60._12_4_;
          fStack_5d0 = local_1a60._16_4_;
          fStack_5cc = local_1a60._20_4_;
          fStack_5c8 = local_1a60._24_4_;
          *(ulong *)*local_1640 = CONCAT44(fStack_5bc * fStack_5dc,local_5c0 * local_5e0);
          *(ulong *)(*local_1640 + 8) = CONCAT44(fStack_5b4 * fStack_5d4,fStack_5b8 * fStack_5d8);
          *(ulong *)(*local_1640 + 0x10) = CONCAT44(fStack_5ac * fStack_5cc,fStack_5b0 * fStack_5d0)
          ;
          *(ulong *)(*local_1640 + 0x18) = CONCAT44(uStack_5a4,fStack_5a8 * fStack_5c8);
          local_1640 = (undefined1 (*) [64])(*local_1640 + 0x20);
        }
        for (; local_1874 + 3 < iVar21; local_1874 = local_1874 + 4) {
          local_500 = (float)*(undefined8 *)*local_1640;
          fStack_4fc = (float)((ulong)*(undefined8 *)*local_1640 >> 0x20);
          fStack_4f8 = (float)*(undefined8 *)(*local_1640 + 8);
          fStack_4f4 = (float)((ulong)*(undefined8 *)(*local_1640 + 8) >> 0x20);
          local_510 = (float)local_1a40;
          fStack_50c = (float)((ulong)local_1a40 >> 0x20);
          fStack_508 = (float)uStack_1a38;
          fStack_504 = (float)((ulong)uStack_1a38 >> 0x20);
          *(ulong *)*local_1640 = CONCAT44(fStack_4fc * fStack_50c,local_500 * local_510);
          *(ulong *)(*local_1640 + 8) = CONCAT44(fStack_4f4 * fStack_504,fStack_4f8 * fStack_508);
          local_1640 = (undefined1 (*) [64])(*local_1640 + 0x10);
        }
        for (; local_1874 < iVar21; local_1874 = local_1874 + 1) {
          *(float *)*local_1640 = *(float *)*local_1640 * fVar1;
          local_1640 = (undefined1 (*) [64])(*local_1640 + 4);
        }
      }
      else {
        fVar2 = *(float *)(lVar9 + (long)local_1638 * 4);
        if (iVar7 == 4) {
          puVar24 = (undefined8 *)(lVar9 + (long)(local_1638 << 2) * 4);
          local_1ad0 = *puVar24;
          uStack_1ac8 = puVar24[1];
        }
        else {
          local_1ad0 = CONCAT44(fVar2,fVar2);
          uStack_1ac8 = CONCAT44(fVar2,fVar2);
        }
        if (iVar7 == 8) {
          local_1b00 = *(undefined1 (*) [32])(lVar9 + (long)(local_1638 << 3) * 4);
        }
        else {
          local_1b00._8_8_ = uStack_1ac8;
          local_1b00._0_8_ = local_1ad0;
          local_1b00._24_8_ = uStack_1ac8;
          local_1b00._16_8_ = local_1ad0;
        }
        if (iVar7 == 0x10) {
          local_1b40 = *(undefined1 (*) [64])(lVar9 + (long)(local_1638 << 4) * 4);
        }
        else {
          local_1b40 = vinsertf64x4_avx512f(ZEXT3264(local_1b00),local_1b00,1);
        }
        for (local_17c4 = 0; local_17c4 + 0xf < iVar21; local_17c4 = local_17c4 + 0x10) {
          auVar29 = vfmadd213ps_avx512f(local_1ac0,*local_1640,local_1b40);
          local_f80 = auVar29._0_8_;
          uStack_f78 = auVar29._8_8_;
          uStack_f70 = auVar29._16_8_;
          uStack_f68 = auVar29._24_8_;
          uStack_f60 = auVar29._32_8_;
          uStack_f58 = auVar29._40_8_;
          uStack_f50 = auVar29._48_8_;
          uStack_f48 = auVar29._56_8_;
          *(undefined8 *)*local_1640 = local_f80;
          *(undefined8 *)(*local_1640 + 8) = uStack_f78;
          *(undefined8 *)(*local_1640 + 0x10) = uStack_f70;
          *(undefined8 *)(*local_1640 + 0x18) = uStack_f68;
          *(undefined8 *)(*local_1640 + 0x20) = uStack_f60;
          *(undefined8 *)(*local_1640 + 0x28) = uStack_f58;
          *(undefined8 *)(*local_1640 + 0x30) = uStack_f50;
          *(undefined8 *)(*local_1640 + 0x38) = uStack_f48;
          local_1640 = local_1640 + 1;
        }
        for (; local_17c4 + 7 < iVar21; local_17c4 = local_17c4 + 8) {
          auVar11 = vfmadd213ps_fma(local_1a60,*(undefined1 (*) [32])*local_1640,local_1b00);
          local_9e0 = auVar11._0_8_;
          uStack_9d8 = auVar11._8_8_;
          *(undefined8 *)*local_1640 = local_9e0;
          *(undefined8 *)(*local_1640 + 8) = uStack_9d8;
          *(undefined8 *)(*local_1640 + 0x10) = 0;
          *(undefined8 *)(*local_1640 + 0x18) = 0;
          local_1640 = (undefined1 (*) [64])(*local_1640 + 0x20);
        }
        for (; local_17c4 + 3 < iVar21; local_17c4 = local_17c4 + 4) {
          auVar18._8_8_ = uStack_1a38;
          auVar18._0_8_ = local_1a40;
          auVar17._8_8_ = uStack_1ac8;
          auVar17._0_8_ = local_1ad0;
          auVar11 = vfmadd213ps_fma(auVar18,*(undefined1 (*) [16])*local_1640,auVar17);
          local_330 = auVar11._0_8_;
          uStack_328 = auVar11._8_8_;
          *(undefined8 *)*local_1640 = local_330;
          *(undefined8 *)(*local_1640 + 8) = uStack_328;
          local_1640 = (undefined1 (*) [64])(*local_1640 + 0x10);
        }
        for (; local_17c4 < iVar21; local_17c4 = local_17c4 + 1) {
          *(float *)*local_1640 = *(float *)*local_1640 * fVar1 + fVar2;
          local_1640 = (undefined1 (*) [64])(*local_1640 + 4);
        }
      }
    }
  }
  return 0;
}

Assistant:

int Scale_x86_avx512::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    Mat& bottom_top_blob = bottom_top_blobs[0];
    const Mat& scale_blob = bottom_top_blobs[1];

    const int w = bottom_top_blob.w;
    const int h = bottom_top_blob.h;
    const int d = bottom_top_blob.d;
    const int channels = bottom_top_blob.c;
    const int dims = bottom_top_blob.dims;

    const int elempack = bottom_top_blob.elempack;

    const float* scale = scale_blob;
    const float* bias = bias_data;

    if (dims == 1)
    {
        float* ptr = (float*)bottom_top_blob;
        const int size = w * elempack;

        if (bias_term)
        {
            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _s512 = _mm512_loadu_ps(scale + i);
                __m512 _bias512 = _mm512_loadu_ps(bias + i);
                _mm512_storeu_ps(ptr + i, _mm512_fmadd_ps(_p512, _s512, _bias512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _s256 = _mm256_loadu_ps(scale + i);
                __m256 _bias256 = _mm256_loadu_ps(bias + i);
                _mm256_storeu_ps(ptr + i, _mm256_comp_fmadd_ps(_p256, _s256, _bias256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _s128 = _mm_load_ps(scale + i);
                __m128 _bias128 = _mm_loadu_ps(bias + i);
                _mm_store_ps(ptr + i, _mm_comp_fmadd_ps(_p128, _s128, _bias128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                ptr[i] = ptr[i] * scale[i] + bias[i];
            }
        }
        else
        {
            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _s512 = _mm512_loadu_ps(scale + i);
                _mm512_storeu_ps(ptr + i, _mm512_mul_ps(_p512, _s512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _s256 = _mm256_loadu_ps(scale + i);
                _mm256_storeu_ps(ptr + i, _mm256_mul_ps(_p256, _s256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _s128 = _mm_load_ps(scale + i);
                _mm_store_ps(ptr + i, _mm_mul_ps(_p128, _s128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                ptr[i] = ptr[i] * scale[i];
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            float s = scale[i];
#if __SSE2__
            __m128 _s128 = (elempack == 4) ? _mm_loadu_ps(scale + i * 4) : _mm_set1_ps(s);
#if __AVX__
            __m256 _s256 = (elempack == 8) ? _mm256_loadu_ps(scale + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_s128), _s128, 1);
#if __AVX512F__
            __m512 _s512 = (elempack == 16) ? _mm512_loadu_ps(scale + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_s256), _s256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            if (bias_term)
            {
                float b = bias[i];
#if __SSE2__
                __m128 _b128 = (elempack == 4) ? _mm_loadu_ps(bias + i * 4) : _mm_set1_ps(b);
#if __AVX__
                __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps(bias + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
                __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps(bias + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; j + 15 < size; j += 16)
                {
                    __m512 _p512 = _mm512_loadu_ps(ptr);
                    _mm512_storeu_ps(ptr, _mm512_fmadd_ps(_p512, _s512, _b512));
                    ptr += 16;
                }
#endif // __AVX512F__
                for (; j + 7 < size; j += 8)
                {
                    __m256 _p256 = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, _mm256_comp_fmadd_ps(_p256, _s256, _b256));
                    ptr += 8;
                }
#endif // __AVX__
                for (; j + 3 < size; j += 4)
                {
                    __m128 _p128 = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, _mm_comp_fmadd_ps(_p128, _s128, _b128));
                    ptr += 4;
                }
#endif // __SSE__
                for (; j < size; j++)
                {
                    *ptr = *ptr * s + b;
                    ptr++;
                }
            }
            else
            {
                int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; j + 15 < size; j += 16)
                {
                    __m512 _p512 = _mm512_loadu_ps(ptr);
                    _mm512_storeu_ps(ptr, _mm512_mul_ps(_p512, _s512));
                    ptr += 16;
                }
#endif // __AVX512F__
                for (; j + 7 < size; j += 8)
                {
                    __m256 _p256 = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, _mm256_mul_ps(_p256, _s256));
                    ptr += 8;
                }
#endif // __AVX__
                for (; j + 3 < size; j += 4)
                {
                    __m128 _p128 = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, _mm_mul_ps(_p128, _s128));
                    ptr += 4;
                }
#endif // __SSE__
                for (; j < size; j++)
                {
                    *ptr = *ptr * s;
                    ptr++;
                }
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float s = scale[q];
#if __SSE2__
            __m128 _s128 = (elempack == 4) ? _mm_loadu_ps(scale + q * 4) : _mm_set1_ps(s);
#if __AVX__
            __m256 _s256 = (elempack == 8) ? _mm256_loadu_ps(scale + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_s128), _s128, 1);
#if __AVX512F__
            __m512 _s512 = (elempack == 16) ? _mm512_loadu_ps(scale + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_s256), _s256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            if (bias_term)
            {
                float b = bias[q];
#if __SSE2__
                __m128 _b128 = (elempack == 4) ? _mm_loadu_ps(bias + q * 4) : _mm_set1_ps(b);
#if __AVX__
                __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps(bias + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
                __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps(bias + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p512 = _mm512_loadu_ps(ptr);
                    _mm512_storeu_ps(ptr, _mm512_fmadd_ps(_p512, _s512, _b512));
                    ptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p256 = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, _mm256_comp_fmadd_ps(_p256, _s256, _b256));
                    ptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p128 = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, _mm_comp_fmadd_ps(_p128, _s128, _b128));
                    ptr += 4;
                }
#endif // __SSE__
                for (; i < size; i++)
                {
                    *ptr = *ptr * s + b;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p512 = _mm512_loadu_ps(ptr);
                    _mm512_storeu_ps(ptr, _mm512_mul_ps(_p512, _s512));
                    ptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p256 = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, _mm256_mul_ps(_p256, _s256));
                    ptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p128 = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, _mm_mul_ps(_p128, _s128));
                    ptr += 4;
                }
#endif // __SSE__
                for (; i < size; i++)
                {
                    *ptr = *ptr * s;
                    ptr++;
                }
            }
        }
    }

    return 0;
}